

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O1

void __thiscall Player::Player(Player *this,string *role)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  short *psVar3;
  long *plVar4;
  ostream *poVar5;
  long *plVar6;
  long lVar7;
  uint __val;
  char *pcVar8;
  uint __len;
  uint uVar9;
  long lVar10;
  string __str;
  string local_70;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  lVar10 = 0x264;
  do {
    Ship::Ship((Ship *)((long)(this->playerArea + -2) + 0xe + lVar10));
    lVar10 = lVar10 + 0x20;
  } while (lVar10 != 0x3a4);
  psVar3 = this->enemyArea[1] + 1;
  lVar10 = 1;
  do {
    lVar7 = 0;
    do {
      psVar3[lVar7 + -0x90] = 100;
      psVar3[lVar7] = 0;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 10);
    lVar10 = lVar10 + 1;
    psVar3 = psVar3 + 0xc;
  } while (lVar10 != 0xb);
  iVar2 = std::__cxx11::string::compare((char *)role);
  this->role = iVar2 == 0;
  iVar2 = rand();
  uVar9 = iVar2 % 99 + 1;
  __val = -uVar9;
  if (0 < (int)uVar9) {
    __val = uVar9;
  }
  __len = 2 - (__val < 10);
  paVar1 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_70,(char)__len - (char)((int)uVar9 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_70._M_dataplus._M_p + (uVar9 >> 0x1f),__len,__val);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x10607f);
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_40 = *plVar6;
    lStack_38 = plVar4[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar6;
    local_50 = (long *)*plVar4;
  }
  local_48 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::_M_assign((string *)this);
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  pcVar8 = "AI";
  if ((ulong)this->role != 0) {
    pcVar8 = "Human";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,pcVar8,(ulong)this->role * 3 + 2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," is being created as ",0x15);
  getName_abi_cxx11_(&local_70,this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_70._M_dataplus._M_p,local_70._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

Player::Player(std::string role) {
    for(int i = 1; i <= 10; i++)
        for(int j = 1; j <= 10; j++)
        {
            playerArea[i][j] = Player::FREE_CODE;
            enemyArea[i][j] = Player::UNKNOWN_CODE;
        }
    setRole(role == "human"); //TRUE if human, else FALSE
    setName("Player_" + std::to_string(rand() % 99 + 1)); //name as Player_NN
    initShips();

    //log
    getRole() ? std::cout << "Human" : std::cout << "AI";
    std::cout << " is being created as " << getName() << std::endl;


}